

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O3

environment_params_t * __thiscall
so_5::environment_params_t::add_named_dispatcher
          (environment_params_t *this,nonempty_name_t *name,dispatcher_unique_ptr_t *dispatcher)

{
  dispatcher_t *__p;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  mapped_type *pmVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  __p = (dispatcher->_M_t).
        super___uniq_ptr_impl<so_5::dispatcher_t,_std::default_delete<so_5::dispatcher_t>_>._M_t.
        super__Tuple_impl<0UL,_so_5::dispatcher_t_*,_std::default_delete<so_5::dispatcher_t>_>.
        super__Head_base<0UL,_so_5::dispatcher_t_*,_false>._M_head_impl;
  (dispatcher->_M_t).
  super___uniq_ptr_impl<so_5::dispatcher_t,_std::default_delete<so_5::dispatcher_t>_>._M_t.
  super__Tuple_impl<0UL,_so_5::dispatcher_t_*,_std::default_delete<so_5::dispatcher_t>_>.
  super__Head_base<0UL,_so_5::dispatcher_t_*,_false>._M_head_impl = (dispatcher_t *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<so_5::dispatcher_t*>
            (a_Stack_20,__p);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>_>
           ::operator[](&this->m_named_dispatcher_map,&name->m_nonempty_name);
  _Var1._M_pi = a_Stack_20[0]._M_pi;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (pmVar2->super___shared_ptr<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2>)._M_refcount
            ._M_pi;
  (pmVar2->super___shared_ptr<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = __p;
  (pmVar2->super___shared_ptr<so_5::dispatcher_t,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       _Var1._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
  }
  return this;
}

Assistant:

environment_params_t &
environment_params_t::add_named_dispatcher(
	nonempty_name_t name,
	dispatcher_unique_ptr_t dispatcher )
{
	m_named_dispatcher_map[ name.query_name() ] =
		dispatcher_ref_t( dispatcher.release() );
	return *this;
}